

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

type __thiscall
fmt::v5::format_to<std::ostream_iterator<char,char,std::char_traits<char>>,char[3],int>
          (v5 *this,ostream_iterator<char,_char,_std::char_traits<char>_> *out,
          char (*format_str) [3],int *args)

{
  type tVar1;
  type args_00;
  format_arg_store<fmt::v5::basic_format_context<std::ostream_iterator<char,_char,_std::char_traits<char>_>,_char>,_int>
  as;
  basic_string_view<char> local_48;
  ulong local_38;
  basic_string_view<char> local_28;
  
  local_38 = (ulong)(uint)*args;
  local_48.data_ = (char *)out->_M_stream;
  local_48.size_ = (size_t)out->_M_string;
  local_28 = to_string_view<char>(*format_str);
  args_00.field_1.values_ =
       format_arg_store<fmt::v5::basic_format_context<std::ostream_iterator<char,char,std::char_traits<char>>,char>,int>
       ::TYPES.values_;
  args_00.types_ = (unsigned_long_long)&local_28;
  tVar1 = vformat_to<fmt::v5::basic_string_view<char>,std::ostream_iterator<char,char,std::char_traits<char>>>
                    ((ostream_iterator<char,_char,_std::char_traits<char>_> *)this,&local_48,args_00
                    );
  tVar1._M_stream = (ostream_type *)this;
  return tVar1;
}

Assistant:

format_to(OutputIt out, const S &format_str, const Args &... args) {
  internal::check_format_string<Args...>(format_str);
  typedef typename format_context_t<OutputIt, FMT_CHAR(S)>::type context;
  format_arg_store<context, Args...> as{args...};
  return vformat_to(out, to_string_view(format_str),
                    basic_format_args<context>(as));
}